

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O0

void print_help(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"s: toggle stagger");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"r: toggle max rank");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"1: toggle max rank of 1");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"z: toggle max size");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"w: toggle fixed width");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"h: toggle fixed height");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"a: switch h alignment");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"b: switch v alignment");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"i: toggle indent");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"S: switch between 4 and 8 item mode");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"T: toggle the creation of an instance");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"q: quit");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
print_help()
{
  cout << "s: toggle stagger" << endl;
  cout << "r: toggle max rank" << endl;
  cout << "1: toggle max rank of 1" << endl;
  cout << "z: toggle max size" << endl;
  cout << "w: toggle fixed width" << endl;
  cout << "h: toggle fixed height" << endl;
  cout << "a: switch h alignment" << endl;
  cout << "b: switch v alignment" << endl;
  cout << "i: toggle indent" << endl;
  cout << "S: switch between 4 and 8 item mode" << endl;
  cout << "T: toggle the creation of an instance" << endl;
  cout << "q: quit" << endl;
}